

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCOBBTree.cpp
# Opt level: O1

void chrono::collision::make_parent_relative
               (CHOBBTree *m,int bn,ChMatrix33<double> *parentR,Vector *parentTo)

{
  Vector *parentTo_00;
  double *pdVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int bn_00;
  double dVar8;
  double dVar9;
  double dVar10;
  pointer pCVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  ChMatrix33<double> *local_38;
  pointer local_30;
  
  if (make_parent_relative(chrono::collision::CHOBBTree*,int,chrono::ChMatrix33<double>&,chrono::ChVector<double>&)
      ::Rpc == '\0') {
    make_parent_relative();
  }
  if (make_parent_relative(chrono::collision::CHOBBTree*,int,chrono::ChMatrix33<double>&,chrono::ChVector<double>&)
      ::Tpc == '\0') {
    make_parent_relative();
  }
  pCVar11 = (m->b).
            super__Vector_base<chrono::collision::CHOBB,_std::allocator<chrono::collision::CHOBB>_>.
            _M_impl.super__Vector_impl_data._M_start;
  bn_00 = pCVar11[bn].first_child;
  if (-1 < bn_00) {
    pCVar11 = pCVar11 + bn;
    make_parent_relative(m,bn_00,&pCVar11->Rot,&pCVar11->To);
    pCVar11 = (m->b).
              super__Vector_base<chrono::collision::CHOBB,_std::allocator<chrono::collision::CHOBB>_>
              ._M_impl.super__Vector_impl_data._M_start;
    parentTo_00 = &pCVar11[bn].To;
    make_parent_relative(m,*(int *)(parentTo_00 + 2) + 1,&pCVar11[bn].Rot,parentTo_00);
  }
  local_30 = (m->b).
             super__Vector_base<chrono::collision::CHOBB,_std::allocator<chrono::collision::CHOBB>_>
             ._M_impl.super__Vector_impl_data._M_start + bn;
  local_38 = parentR;
  ChMatrix33<double>::operator=
            (&make_parent_relative::Rpc,
             (MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
              *)&local_38);
  dVar8 = make_parent_relative::Rpc.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  pCVar11 = (m->b).
            super__Vector_base<chrono::collision::CHOBB,_std::allocator<chrono::collision::CHOBB>_>.
            _M_impl.super__Vector_impl_data._M_start;
  *(double *)
   &pCVar11[bn].Rot.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> =
       make_parent_relative::Rpc.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  *(double *)
   ((long)&pCVar11[bn].Rot.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> + 8) = dVar8;
  dVar8 = make_parent_relative::Rpc.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  pdVar1 = (double *)
           ((long)&pCVar11[bn].Rot.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> + 0x10);
  *pdVar1 = make_parent_relative::Rpc.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  pdVar1[1] = dVar8;
  dVar8 = make_parent_relative::Rpc.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  pdVar1 = (double *)
           ((long)&pCVar11[bn].Rot.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> + 0x20);
  *pdVar1 = make_parent_relative::Rpc.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  pdVar1[1] = dVar8;
  dVar8 = make_parent_relative::Rpc.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  pdVar1 = (double *)
           ((long)&pCVar11[bn].Rot.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> + 0x30);
  *pdVar1 = make_parent_relative::Rpc.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  pdVar1[1] = dVar8;
  *(double *)
   ((long)&pCVar11[bn].Rot.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> + 0x40) =
       make_parent_relative::Rpc.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  pCVar11 = (m->b).
            super__Vector_base<chrono::collision::CHOBB,_std::allocator<chrono::collision::CHOBB>_>.
            _M_impl.super__Vector_impl_data._M_start;
  dVar8 = pCVar11[bn].To.m_data[0] - parentTo->m_data[0];
  dVar9 = pCVar11[bn].To.m_data[1] - parentTo->m_data[1];
  dVar10 = pCVar11[bn].To.m_data[2] - parentTo->m_data[2];
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (parentR->super_Matrix<double,_3,_3,_1,_3,_3>).
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar8;
  auVar17._8_8_ = 0;
  auVar17._0_8_ =
       dVar9 * (parentR->super_Matrix<double,_3,_3,_1,_3,_3>).
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [3];
  auVar2 = vfmadd231sd_fma(auVar17,auVar12,auVar2);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (parentR->super_Matrix<double,_3,_3,_1,_3,_3>).
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [6];
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar10;
  auVar2 = vfmadd231sd_fma(auVar2,auVar15,auVar3);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (parentR->super_Matrix<double,_3,_3,_1,_3,_3>).
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [1];
  auVar18._8_8_ = 0;
  auVar18._0_8_ =
       dVar9 * (parentR->super_Matrix<double,_3,_3,_1,_3,_3>).
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [4];
  auVar3 = vfmadd231sd_fma(auVar18,auVar12,auVar4);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (parentR->super_Matrix<double,_3,_3,_1,_3,_3>).
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [7];
  auVar3 = vfmadd231sd_fma(auVar3,auVar15,auVar5);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (parentR->super_Matrix<double,_3,_3,_1,_3,_3>).
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [2];
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar8;
  auVar14._8_8_ = 0;
  auVar14._0_8_ =
       dVar9 * (parentR->super_Matrix<double,_3,_3,_1,_3,_3>).
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [5];
  auVar4 = vfmadd231sd_fma(auVar14,auVar13,auVar6);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = (parentR->super_Matrix<double,_3,_3,_1,_3,_3>).
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [8];
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar10;
  auVar4 = vfmadd231sd_fma(auVar4,auVar16,auVar7);
  pCVar11[bn].To.m_data[0] = auVar2._0_8_;
  pCVar11[bn].To.m_data[1] = auVar3._0_8_;
  pCVar11[bn].To.m_data[2] = auVar4._0_8_;
  return;
}

Assistant:

void make_parent_relative(CHOBBTree* m, int bn, ChMatrix33<>& parentR, Vector& parentTo) {
    static ChMatrix33<> Rpc;
    static Vector Tpc;

    if (!m->child(bn)->IsLeaf()) {
        // make children parent-relative

        make_parent_relative(m, m->child(bn)->first_child, m->child(bn)->Rot, m->child(bn)->To);
        make_parent_relative(m, m->child(bn)->first_child + 1, m->child(bn)->Rot, m->child(bn)->To);
    }

    // make self parent relative

    Rpc = parentR.transpose() * m->child(bn)->Rot;  // MTxM(Rpc,parentR,m->child(bn)->R);
    m->child(bn)->Rot = Rpc;                        // McM(m->child(bn)->R,Rpc);
    Tpc = Vsub(m->child(bn)->To, parentTo);         // VmV(Tpc,m->child(bn)->To,parentTo);
    m->child(bn)->To = parentR.transpose() * Tpc;   // Tpc MTxV(m->child(bn)->To,parentR,Tpc);
}